

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::~DBImpl(DBImpl *this)

{
  VersionSet *this_00;
  WriteBatch *this_01;
  Writer *this_02;
  TableCache *this_03;
  Logger *pLVar1;
  Cache *pCVar2;
  long in_FS_OFFSET;
  Status SStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DB)._vptr_DB = (_func_int **)&PTR__DBImpl_00a28230;
  std::mutex::lock(&(this->mutex_).mu_);
  (this->shutting_down_)._M_base._M_i = true;
  while (this->background_compaction_scheduled_ == true) {
    port::CondVar::Wait(&this->background_work_finished_signal_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  if (this->db_lock_ != (FileLock *)0x0) {
    (*this->env_->_vptr_Env[0xe])(&SStack_28);
    Status::~Status(&SStack_28);
  }
  this_00 = this->versions_;
  if (this_00 != (VersionSet *)0x0) {
    VersionSet::~VersionSet(this_00);
  }
  operator_delete(this_00,0x250);
  if (this->mem_ != (MemTable *)0x0) {
    MemTable::Unref(this->mem_);
  }
  if (this->imm_ != (MemTable *)0x0) {
    MemTable::Unref(this->imm_);
  }
  this_01 = this->tmp_batch_;
  if (this_01 != (WriteBatch *)0x0) {
    WriteBatch::~WriteBatch(this_01);
  }
  operator_delete(this_01,0x20);
  this_02 = this->log_;
  if (this_02 != (Writer *)0x0) {
    log::Writer::~Writer(this_02);
  }
  operator_delete(this_02,0x20);
  if (this->logfile_ != (WritableFile *)0x0) {
    (*this->logfile_->_vptr_WritableFile[1])();
  }
  this_03 = this->table_cache_;
  if (this_03 != (TableCache *)0x0) {
    TableCache::~TableCache(this_03);
  }
  operator_delete(this_03,0x38);
  if ((this->owns_info_log_ == true) &&
     (pLVar1 = (this->options_).info_log, pLVar1 != (Logger *)0x0)) {
    (*pLVar1->_vptr_Logger[1])();
  }
  if ((this->owns_cache_ == true) && (pCVar2 = (this->options_).block_cache, pCVar2 != (Cache *)0x0)
     ) {
    (*pCVar2->_vptr_Cache[1])();
  }
  Status::~Status(&this->bg_error_);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&(this->pending_outputs_)._M_t);
  std::_Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
  ~_Deque_base(&(this->writers_).
                super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
              );
  std::condition_variable::~condition_variable(&(this->background_work_finished_signal_).cv_);
  std::__cxx11::string::~string((string *)&this->dbname_);
  FilterPolicy::~FilterPolicy(&(this->internal_filter_policy_).super_FilterPolicy);
  Comparator::~Comparator(&(this->internal_comparator_).super_Comparator);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DBImpl::~DBImpl() {
  // Wait for background work to finish.
  mutex_.Lock();
  shutting_down_.store(true, std::memory_order_release);
  while (background_compaction_scheduled_) {
    background_work_finished_signal_.Wait();
  }
  mutex_.Unlock();

  if (db_lock_ != nullptr) {
    env_->UnlockFile(db_lock_);
  }

  delete versions_;
  if (mem_ != nullptr) mem_->Unref();
  if (imm_ != nullptr) imm_->Unref();
  delete tmp_batch_;
  delete log_;
  delete logfile_;
  delete table_cache_;

  if (owns_info_log_) {
    delete options_.info_log;
  }
  if (owns_cache_) {
    delete options_.block_cache;
  }
}